

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.h
# Opt level: O3

void __thiscall Simulator::label(Simulator *this,PCode *code)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  int iVar3;
  long *plVar4;
  size_type *psVar5;
  string name;
  undefined1 *local_f8;
  long local_f0;
  undefined1 local_e8 [16];
  Symbol local_d8;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  pcVar2 = (code->first_)._M_dataplus._M_p;
  local_f8 = local_e8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f8,pcVar2,pcVar2 + (code->first_)._M_string_length);
  std::__cxx11::string::substr((ulong)&local_d8,(ulong)&local_f8);
  iVar3 = std::__cxx11::string::compare((char *)&local_d8);
  paVar1 = &local_d8.name_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.name_._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8.name_._M_dataplus._M_p);
  }
  if (iVar3 == 0) {
    ScopeTree::push(&this->tree_);
    local_d8.name_._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>((string *)&local_d8,local_f8,local_f8 + local_f0);
    local_d8.type_ = kInt;
    local_d8.value_.int_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_d8.value_.int_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_d8.value_.int_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_d8.value_.real_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_d8.value_.real_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_d8.value_.real_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_d8._36_8_ = 0;
    local_d8.value_.args.super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.
    super__Vector_impl_data._M_start._4_4_ = 0;
    local_d8.value_.args.super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0;
    local_d8.value_.args.super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.
    super__Vector_impl_data._M_finish._4_4_ = 0;
    local_d8.value_.args.super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_d8.is_assigned_ = true;
    local_d8.value_.int_value = 1;
    ScopeTree::define(&this->tree_,&local_d8);
    if (local_d8.value_.real_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_d8.value_.real_array.super__Vector_base<double,_std::allocator<double>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_d8.value_.int_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_d8.value_.int_array.super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    std::vector<Symbol,_std::allocator<Symbol>_>::~vector(&local_d8.value_.args);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8.name_._M_dataplus._M_p != paVar1) {
      operator_delete(local_d8.name_._M_dataplus._M_p);
    }
  }
  else {
    std::__cxx11::string::substr((ulong)&local_d8,(ulong)&local_f8);
    iVar3 = std::__cxx11::string::compare((char *)&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8.name_._M_dataplus._M_p != paVar1) {
      operator_delete(local_d8.name_._M_dataplus._M_p);
    }
    if (iVar3 == 0) {
      do {
        std::__cxx11::string::substr((ulong)local_50,(ulong)&local_f8);
        plVar4 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x14322c);
        psVar5 = (size_type *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar5) {
          local_d8.name_.field_2._M_allocated_capacity = *psVar5;
          local_d8.name_.field_2._8_8_ = plVar4[3];
          local_d8.name_._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_d8.name_.field_2._M_allocated_capacity = *psVar5;
          local_d8.name_._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_d8.name_._M_string_length = plVar4[1];
        *plVar4 = (long)psVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        ScopeTree::resolve(&this->tree_,&local_d8.name_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8.name_._M_dataplus._M_p != paVar1) {
          operator_delete(local_d8.name_._M_dataplus._M_p);
        }
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
        ScopeTree::pop(&this->tree_);
      } while( true );
    }
    std::__cxx11::string::substr((ulong)&local_d8,(ulong)&local_f8);
    iVar3 = std::__cxx11::string::compare((char *)&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8.name_._M_dataplus._M_p != paVar1) {
      operator_delete(local_d8.name_._M_dataplus._M_p);
    }
    if (iVar3 != 0) {
      std::__cxx11::string::substr((ulong)&local_d8,(ulong)&local_f8);
      iVar3 = std::__cxx11::string::compare((char *)&local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8.name_._M_dataplus._M_p != paVar1) {
        operator_delete(local_d8.name_._M_dataplus._M_p);
      }
      if (iVar3 != 0) {
        std::__cxx11::string::substr((ulong)&local_d8,(ulong)&local_f8);
        iVar3 = std::__cxx11::string::compare((char *)&local_d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8.name_._M_dataplus._M_p != paVar1) {
          operator_delete(local_d8.name_._M_dataplus._M_p);
        }
        if (iVar3 == 0) {
          ScopeTree::pop(&this->tree_);
        }
        goto LAB_0011efb5;
      }
      ScopeTree::pop(&this->tree_);
    }
    ScopeTree::push(&this->tree_);
  }
LAB_0011efb5:
  this->eip_ = this->eip_ + 1;
  if (local_f8 != local_e8) {
    operator_delete(local_f8);
  }
  return;
}

Assistant:

void Simulator::label(const PCode &code) {
    std::string name = code.first();

    if (name.substr(0, 13) == "_begin_while_") {
        tree_.push();
        tree_.define(Symbol(name, 1, true));
    } else if (name.substr(0, 11) == "_end_while_") {
        while (true) {
            bool is_found = false;
            try {
                tree_.resolve("_begin_while_" + name.substr(11));
                tree_.pop();
                is_found = true;
            } catch (const scope_not_found &e) {
                is_found = false;
            }
            if (!is_found) {
                break;
            }
        }
    } else if (name.substr(0, 10) == "_begin_if_") {
        tree_.push();
    } else if (name.substr(0, 6) == "_else_") {
        tree_.pop();
        tree_.push();
    } else if (name.substr(0, 8) == "_end_if_") {
        tree_.pop();
    }

    inc_eip();
}